

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

environment_infrastructure_factory_t *
so_5::env_infrastructures::simple_not_mtsafe::factory
          (environment_infrastructure_factory_t *__return_storage_ptr__,
          params_t *infrastructure_params)

{
  anon_class_32_1_166bb0c2 local_38;
  params_t *local_18;
  params_t *infrastructure_params_local;
  
  local_18 = infrastructure_params;
  infrastructure_params_local = (params_t *)__return_storage_ptr__;
  params_t::params_t(&local_38.infrastructure_params,infrastructure_params);
  std::
  function<std::unique_ptr<so_5::environment_infrastructure_t,void(*)(so_5::environment_infrastructure_t*)>(so_5::environment_t&,so_5::environment_params_t&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>)>
  ::
  function<so_5::env_infrastructures::simple_not_mtsafe::factory(so_5::env_infrastructures::simple_not_mtsafe::params_t&&)::__0,void>
            ((function<std::unique_ptr<so_5::environment_infrastructure_t,void(*)(so_5::environment_infrastructure_t*)>(so_5::environment_t&,so_5::environment_params_t&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>)>
              *)__return_storage_ptr__,&local_38);
  factory(so_5::env_infrastructures::simple_not_mtsafe::params_t&&)::$_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC environment_infrastructure_factory_t
factory( params_t && infrastructure_params )
	{
		using namespace impl;

		return [infrastructure_params](
				environment_t & env,
				environment_params_t & env_params,
				mbox_t stats_distribution_mbox )
		{
			ensure_autoshutdown_enabled( env_params );

			environment_infrastructure_t * obj = nullptr;

			const auto & timer_manager_factory =
					infrastructure_params.timer_manager();

			// Create environment infrastructure object in dependence of
			// work thread activity tracking flag.
			const auto tracking = env_params.work_thread_activity_tracking();
			if( work_thread_activity_tracking_t::on == tracking )
				obj = new env_infrastructure_t< reusable::real_activity_tracker_t >(
					env,
					std::move(timer_manager_factory),
					env_params.so5__error_logger(),
					env_params.so5__giveout_coop_listener(),
					std::move(stats_distribution_mbox) );
			else
				obj = new env_infrastructure_t< reusable::fake_activity_tracker_t >(
					env,
					std::move(timer_manager_factory),
					env_params.so5__error_logger(),
					env_params.so5__giveout_coop_listener(),
					std::move(stats_distribution_mbox) );

			return environment_infrastructure_unique_ptr_t(
					obj,
					environment_infrastructure_t::default_deleter() );
		};
	}